

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O3

void __thiscall gmlc::concurrency::DelayedObjects<int>::~DelayedObjects(DelayedObjects<int> *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  map<int,_std::promise<int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<int>_>_>_>
  *__range3;
  int local_30 [2];
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->promiseLock);
  if (iVar2 == 0) {
    p_Var3 = (this->promiseByInteger)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->promiseByInteger)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var1) {
      do {
        local_30[1] = 0;
        std::promise<int>::set_value((promise<int> *)&p_Var3[1]._M_parent,local_30 + 1);
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var1);
    }
    p_Var3 = (this->promiseByString)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->promiseByString)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var1) {
      do {
        local_30[0] = 0;
        std::promise<int>::set_value((promise<int> *)(p_Var3 + 2),local_30);
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->promiseLock);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>_>_>
    ::~_Rb_tree(&(this->usedPromiseByString)._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::promise<int>_>,_std::_Select1st<std::pair<const_int,_std::promise<int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<int>_>_>_>
    ::~_Rb_tree(&(this->usedPromiseByInteger)._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>_>_>
    ::~_Rb_tree(&(this->promiseByString)._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::promise<int>_>,_std::_Select1st<std::pair<const_int,_std::promise<int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<int>_>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::promise<int>_>,_std::_Select1st<std::pair<const_int,_std::promise<int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<int>_>_>_>
                 *)this);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

~DelayedObjects()
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        for (auto& obj : promiseByInteger) {
            obj.second.set_value(X{});
        }
        for (auto& obj : promiseByString) {
            obj.second.set_value(X{});
        }
    }